

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

void sx__job_remove_list(sx__job **pfirst,sx__job **plast,sx__job *node)

{
  sx__job *node_local;
  sx__job **plast_local;
  sx__job **pfirst_local;
  
  if (node->prev != (sx__job *)0x0) {
    node->prev->next = node->next;
  }
  if (node->next != (sx__job *)0x0) {
    node->next->prev = node->prev;
  }
  if (*pfirst == node) {
    *pfirst = node->next;
  }
  if (*plast == node) {
    *plast = node->prev;
  }
  node->next = (sx__job *)0x0;
  node->prev = (sx__job *)0x0;
  return;
}

Assistant:

static inline void sx__job_remove_list(sx__job** pfirst, sx__job** plast, sx__job* node)
{
    if (node->prev)
        node->prev->next = node->next;
    if (node->next)
        node->next->prev = node->prev;
    if (*pfirst == node)
        *pfirst = node->next;
    if (*plast == node)
        *plast = node->prev;
    node->prev = node->next = NULL;
}